

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype.cc
# Opt level: O0

void __thiscall verona::Assume::Assume(Assume *this,Btype *sub_,Btype *sup_)

{
  bool bVar1;
  element_type *this_00;
  Token local_58 [3];
  Token local_40;
  Token local_38;
  initializer_list<trieste::Token> local_30;
  Btype *local_20;
  Btype *sup__local;
  Btype *sub__local;
  Assume *this_local;
  
  local_20 = sup_;
  sup__local = sub_;
  sub__local = &this->sub;
  std::shared_ptr<verona::BtypeDef>::shared_ptr
            ((shared_ptr<verona::BtypeDef> *)this,(shared_ptr<verona::BtypeDef> *)sub_);
  std::shared_ptr<verona::BtypeDef>::shared_ptr
            ((shared_ptr<verona::BtypeDef> *)&this->sup,(shared_ptr<verona::BtypeDef> *)sup_);
  this_00 = ::std::__shared_ptr_access<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  trieste::Token::Token(&local_40,(TokenDef *)Class);
  trieste::Token::Token(&local_38,(TokenDef *)Trait);
  local_30._M_array = &local_40;
  local_30._M_len = 2;
  bVar1 = BtypeDef::in(this_00,&local_30);
  if (!bVar1) {
    __assert_fail("sub->in({Class, Trait})",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/subtype.cc"
                  ,0x25,"verona::Assume::Assume(Btype, Btype)");
  }
  trieste::Token::Token(local_58,(TokenDef *)Trait);
  bVar1 = verona::operator==(&this->sup,local_58);
  if (!bVar1) {
    __assert_fail("sup == Trait",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/subtype.cc"
                  ,0x26,"verona::Assume::Assume(Btype, Btype)");
  }
  return;
}

Assistant:

Assume(Btype sub_, Btype sup_) : sub(sub_), sup(sup_)
    {
      assert(sub->in({Class, Trait}));
      assert(sup == Trait);
    }